

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

void __thiscall flexbuffers::Builder::Double(Builder *this,double f)

{
  pointer *ppVVar1;
  iterator __position;
  ulong uVar2;
  uint uVar3;
  anon_union_8_3_83789bcb_for_Value_0 local_10;
  undefined4 uStack_8;
  uint uStack_4;
  
  uStack_8 = 3;
  uVar3 = -(uint)((double)(float)f == f) & 1;
  uStack_4 = uVar3 ^ 3;
  __position._M_current =
       (this->stack_).
       super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->stack_).
      super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_10.f_ = f;
    std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
    _M_realloc_insert<flexbuffers::Builder::Value>(&this->stack_,__position,(Value *)&local_10);
  }
  else {
    uVar2 = CONCAT44(uVar3,3) ^ 0x300000000;
    ((__position._M_current)->field_0).f_ = f;
    (__position._M_current)->type_ = (int)uVar2;
    (__position._M_current)->min_bit_width_ = (int)(uVar2 >> 0x20);
    ppVVar1 = &(this->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return;
}

Assistant:

void Double(double f) { stack_.push_back(Value(f)); }